

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATests.cpp
# Opt level: O0

void __thiscall TestAnalysis::TestAnalysis(TestAnalysis *this,Symbol *symbol)

{
  Diagnostics *in_RSI;
  Symbol *in_RDI;
  AbstractFlowAnalysis<TestAnalysis,_int> *unaff_retaddr;
  AnalysisOptions in_stack_00000018;
  bitmask<slang::analysis::AnalysisFlags> local_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  memset(&local_1c,0,4);
  slang::bitmask<slang::analysis::AnalysisFlags>::bitmask(&local_1c);
  uStack_18 = 0;
  local_14 = 0xffff;
  slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::FlowAnalysisBase
            (unaff_retaddr,in_RDI,in_stack_00000018,in_RSI);
  return;
}

Assistant:

TestAnalysis(const Symbol& symbol) : AbstractFlowAnalysis(symbol, {}) {}